

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus
DecodeDaddiGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus extraout_EAX;
  MCRegisterClass *pMVar1;
  uint Op;
  uint uVar2;
  uint uVar3;
  
  uVar3 = insn >> 0x15 & 0x1f;
  uVar2 = insn >> 0x10 & 0x1f;
  Op = 0x111;
  if ((uVar3 < uVar2) && (Op = 0x103, uVar3 == 0)) {
    MCInst_setOpcode(MI,0x10d);
  }
  else {
    MCInst_setOpcode(MI,Op);
    pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
    MCOperand_CreateReg0(MI,(uint)pMVar1->RegsBegin[uVar3]);
  }
  pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  MCOperand_CreateReg0(MI,(uint)pMVar1->RegsBegin[uVar2]);
  MCOperand_CreateImm0(MI,(ulong)(uint)((int)(short)insn << 2));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeDaddiGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the ADDI instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b011000 sssss ttttt iiiiiiiiiiiiiiii
	//      BNVC if rs >= rt
	//      BNEZALC if rs == 0 && rt != 0
	//      BNEC if rs < rt && rs != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rs >= Rt) {
		MCInst_setOpcode(MI, Mips_BNVC);
		HasRs = true;
	} else if (Rs != 0 && Rs < Rt) {
		MCInst_setOpcode(MI, Mips_BNEC);
		HasRs = true;
	} else
		MCInst_setOpcode(MI, Mips_BNEZALC);

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));
	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}